

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineLayoutVk.hpp
# Opt level: O2

Uint32 __thiscall
Diligent::PipelineLayoutVk::GetFirstDescrSetIndex(PipelineLayoutVk *this,Uint32 Index)

{
  char (*in_RCX) [27];
  string msg;
  
  if (this->m_DbgMaxBindIndex < Index) {
    FormatString<char[26],char[27]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Index <= m_DbgMaxBindIndex",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetFirstDescrSetIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/PipelineLayoutVk.hpp"
               ,0x3a);
    std::__cxx11::string::~string((string *)&msg);
  }
  return (Uint32)(this->m_FirstDescrSetIndex)._M_elems[Index];
}

Assistant:

Uint32 GetFirstDescrSetIndex(Uint32 Index) const
    {
        VERIFY_EXPR(Index <= m_DbgMaxBindIndex);
        return m_FirstDescrSetIndex[Index];
    }